

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

uint getSibling(tree_t *tree,uint node)

{
  _Bool _Var1;
  uint in_ESI;
  long in_RDI;
  undefined4 local_4;
  
  _Var1 = isLeftChild(in_ESI);
  if (_Var1) {
    if (in_ESI + 1 < *(uint *)(in_RDI + 0x18)) {
      local_4 = in_ESI + 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = in_ESI - 1;
  }
  return local_4;
}

Assistant:

static unsigned int getSibling(const tree_t* tree, unsigned int node) {
  assert(node < tree->numNodes);
  assert(node != 0);
  assert(hasSibling(tree, node));

  if (isLeftChild(node)) {
    if (node + 1 < tree->numNodes) {
      return node + 1;
    } else {
      assert(!"getSibling: request for node with not sibling");
      return 0;
    }
  } else {
    return node - 1;
  }
}